

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

float glu::TextureTestUtil::computeNonProjectedTriLod
                (LodMode mode,IVec2 *dstSize,IVec2 *srcSize,Vec3 *sq,Vec3 *tq)

{
  float fVar1;
  
  fVar1 = computeLodFromDerivates
                    (mode,((sq->m_data[2] - sq->m_data[0]) * (float)srcSize->m_data[0]) /
                          (float)dstSize->m_data[0],
                     ((tq->m_data[2] - tq->m_data[0]) * (float)srcSize->m_data[1]) /
                     (float)dstSize->m_data[0],
                     ((sq->m_data[1] - sq->m_data[0]) * (float)srcSize->m_data[0]) /
                     (float)dstSize->m_data[1],
                     ((tq->m_data[1] - tq->m_data[0]) * (float)srcSize->m_data[1]) /
                     (float)dstSize->m_data[1]);
  return fVar1;
}

Assistant:

T						y			(void) const { DE_STATIC_ASSERT(Size >= 2); return m_data[1]; }